

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::bbox(Fl_Browser_ *this,int *X,int *Y,int *W,int *H)

{
  Fl_Boxtype FVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Fl_Align FVar5;
  Fl_Boxtype local_48;
  int local_44;
  Fl_Boxtype b;
  int scrollsize;
  int *H_local;
  int *W_local;
  int *Y_local;
  int *X_local;
  Fl_Browser_ *this_local;
  
  if (this->scrollbar_size_ == 0) {
    local_44 = Fl::scrollbar_size();
  }
  else {
    local_44 = this->scrollbar_size_;
  }
  FVar1 = Fl_Widget::box((Fl_Widget *)this);
  if (FVar1 == FL_NO_BOX) {
    local_48 = FL_DOWN_BOX;
  }
  else {
    local_48 = Fl_Widget::box((Fl_Widget *)this);
  }
  iVar2 = Fl_Widget::x((Fl_Widget *)this);
  iVar3 = Fl::box_dx(local_48);
  *X = iVar2 + iVar3;
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  iVar3 = Fl::box_dy(local_48);
  *Y = iVar2 + iVar3;
  iVar2 = Fl_Widget::w((Fl_Widget *)this);
  iVar3 = Fl::box_dw(local_48);
  *W = iVar2 - iVar3;
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  iVar3 = Fl::box_dh(local_48);
  *H = iVar2 - iVar3;
  uVar4 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
  if (uVar4 != 0) {
    *W = *W - local_44;
    FVar5 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    if ((FVar5 & 4) != 0) {
      *X = local_44 + *X;
    }
  }
  if (*W < 0) {
    *W = 0;
  }
  uVar4 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
  if (uVar4 != 0) {
    *H = *H - local_44;
    FVar5 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    if ((FVar5 & 1) != 0) {
      *Y = local_44 + *Y;
    }
  }
  if (*H < 0) {
    *H = 0;
  }
  return;
}

Assistant:

void Fl_Browser_::bbox(int& X, int& Y, int& W, int& H) const {
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
  X = x()+Fl::box_dx(b);
  Y = y()+Fl::box_dy(b);
  W = w()-Fl::box_dw(b);
  H = h()-Fl::box_dh(b);
  if (scrollbar.visible()) {
    W -= scrollsize;
    if (scrollbar.align() & FL_ALIGN_LEFT) X += scrollsize;
  }
  if (W < 0) W = 0;
  if (hscrollbar.visible()) {
    H -= scrollsize;
    if (scrollbar.align() & FL_ALIGN_TOP) Y += scrollsize;
  }
  if (H < 0) H = 0;
}